

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ListBoxHeader(char *label,int items_count,int height_in_items)

{
  bool bVar1;
  float fVar2;
  float local_30;
  ImVec2 local_2c;
  ImVec2 size;
  float height_in_items_f;
  ImGuiStyle *style;
  int height_in_items_local;
  int items_count_local;
  char *label_local;
  
  style._0_4_ = height_in_items;
  if (height_in_items < 0) {
    style._0_4_ = ImMin<int>(items_count,7);
  }
  register0x00000000 = GetStyle();
  if ((int)style < items_count) {
    local_30 = (float)(int)style + 0.25;
  }
  else {
    local_30 = (float)(int)style + 0.0;
  }
  size.x = local_30;
  ImVec2::ImVec2(&local_2c);
  local_2c.x = 0.0;
  fVar2 = GetTextLineHeightWithSpacing();
  local_2c.y = fVar2 * size.x + (stack0xffffffffffffffe0->FramePadding).y * 2.0;
  bVar1 = ListBoxHeader(label,&local_2c);
  return bVar1;
}

Assistant:

bool ImGui::ListBoxHeader(const char* label, int items_count, int height_in_items)
{
    // Size default to hold ~7.25 items.
    // We add +25% worth of item height to allow the user to see at a glance if there are more items up/down, without looking at the scrollbar.
    // We don't add this extra bit if items_count <= height_in_items. It is slightly dodgy, because it means a dynamic list of items will make the widget resize occasionally when it crosses that size.
    // I am expecting that someone will come and complain about this behavior in a remote future, then we can advise on a better solution.
    if (height_in_items < 0)
        height_in_items = ImMin(items_count, 7);
    const ImGuiStyle& style = GetStyle();
    float height_in_items_f = (height_in_items < items_count) ? (height_in_items + 0.25f) : (height_in_items + 0.00f);

    // We include ItemSpacing.y so that a list sized for the exact number of items doesn't make a scrollbar appears. We could also enforce that by passing a flag to BeginChild().
    ImVec2 size;
    size.x = 0.0f;
    size.y = GetTextLineHeightWithSpacing() * height_in_items_f + style.FramePadding.y * 2.0f;
    return ListBoxHeader(label, size);
}